

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

ON_Outline * __thiscall ON_OutlineAccumulator::Internal_Outline(ON_OutlineAccumulator *this)

{
  ON_Outline *this_00;
  ON_OutlineAccumulator *this_local;
  
  if (*(long *)(this + 0x50) == 0) {
    this_00 = (ON_Outline *)operator_new(0x78);
    memset(this_00,0,0x78);
    ON_Outline::ON_Outline(this_00);
    *(ON_Outline **)(this + 0x50) = this_00;
    ON_Outline::SetUnitsPerEM(*(ON_Outline **)(this + 0x50),*(ON__UINT32 *)this);
  }
  return *(ON_Outline **)(this + 0x50);
}

Assistant:

ON_Outline& ON_OutlineAccumulator::Internal_Outline()
{
  if (nullptr == m_outline)
  {
    m_outline = new ON_Outline();
    m_outline->SetUnitsPerEM(m_units_per_em);
  }
  return *m_outline;
}